

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_upper(lua_State *L)

{
  char *pcVar1;
  char *pcVar2;
  __int32_t **pp_Var3;
  ulong uVar4;
  size_t l;
  luaL_Buffer b;
  size_t local_440;
  luaL_Buffer local_438;
  
  pcVar1 = luaL_checklstring(L,1,&local_440);
  pcVar2 = luaL_buffinitsize(L,&local_438,local_440);
  if (local_440 == 0) {
    local_440 = 0;
  }
  else {
    uVar4 = 0;
    pp_Var3 = __ctype_toupper_loc();
    do {
      pcVar2[uVar4] = (char)(*pp_Var3)[(byte)pcVar1[uVar4]];
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_440);
  }
  luaL_pushresultsize(&local_438,local_440);
  return 1;
}

Assistant:

static int str_upper (lua_State *L) {
  size_t l;
  size_t i;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  char *p = luaL_buffinitsize(L, &b, l);
  for (i=0; i<l; i++)
    p[i] = cast_char(toupper(cast_uchar(s[i])));
  luaL_pushresultsize(&b, l);
  return 1;
}